

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O2

uint __thiscall
QFragmentMapData<QTextFragmentData>::findNode
          (QFragmentMapData<QTextFragmentData> *this,int k,uint field)

{
  uint uVar1;
  Header *pHVar2;
  Header *pHVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  
  pHVar2 = (this->field_0).head;
  pHVar3 = pHVar2;
  while( true ) {
    while( true ) {
      uVar1 = pHVar3->root;
      if ((ulong)uVar1 == 0) {
        return uVar1;
      }
      lVar4 = (ulong)uVar1 * 0x20;
      uVar5 = *(uint *)((long)pHVar2 + (ulong)field * 4 + lVar4 + 0x10);
      if (uVar5 <= (uint)k) break;
      pHVar3 = (Header *)((long)pHVar2 + lVar4 + 4);
    }
    uVar5 = uVar5 + *(int *)((long)pHVar2 + (ulong)field * 4 + lVar4 + 0x14);
    bVar6 = (uint)k < uVar5;
    k = k - uVar5;
    if (bVar6) break;
    pHVar3 = (Header *)((long)pHVar2 + lVar4 + 8);
  }
  return uVar1;
}

Assistant:

inline uint root() const {
        Q_ASSERT(!head->root || !fragment(head->root)->parent);
        return head->root;
    }